

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  internal *piVar1;
  FILE *__stream;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  _Rb_tree_node_base *p_Var5;
  int line_00;
  size_type sVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  internal *this_00;
  pointer *__ptr;
  char *pcVar7;
  ostream *poVar8;
  pointer __x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  uint local_11c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  char local_f0 [8];
  undefined8 uStack_e8;
  internal *local_e0;
  stringstream *local_d8;
  char *local_d0;
  string local_c8;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  CodeLocation local_78;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,file,(allocator<char> *)local_a8);
  sVar6 = local_f8;
  local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
  if (local_100 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0) {
    local_78.file.field_2._8_8_ = uStack_e8;
  }
  else {
    local_78.file._M_dataplus._M_p = (pointer)local_100;
  }
  local_f8 = 0;
  local_78.file._M_string_length = sVar6;
  local_f0[0] = '\0';
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0;
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  local_e0 = (internal *)file;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_100);
  this->registered_ = true;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (internal *)(registered_tests + -1);
  local_d0 = registered_tests;
  do {
    piVar1 = this_00 + 1;
    this_00 = this_00 + 1;
    bVar2 = IsSpace((char)*piVar1);
  } while (bVar2);
  pcVar7 = extraout_RDX;
  while (this_00 != (internal *)0x0) {
    GetPrefixUntilComma_abi_cxx11_(&local_c8,this_00,pcVar7);
    StripTrailingSpaces((string *)local_a8,&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               (string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_00 = (internal *)SkipComma((char *)this_00);
    pcVar7 = extraout_RDX_00;
  }
  local_11c = line;
  Message::Message((Message *)&local_128);
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  local_d8 = local_128._M_head_impl;
  poVar8 = (ostream *)(local_128._M_head_impl + 0x10);
  __x = local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (_Base_ptr)local_a8._24_8_;
  do {
    if (__x == local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      for (p_Var5 = (this->registered_tests_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          line_00 = (int)sVar6,
          (_Rb_tree_header *)p_Var5 != &(this->registered_tests_)._M_t._M_impl.super__Rb_tree_header
          ; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8,(key_type *)(p_Var5 + 1));
        if (sVar3 == 0) {
          poVar8 = (ostream *)(local_128._M_head_impl + 0x10);
          std::operator<<(poVar8,"You forgot to list test ");
          std::operator<<(poVar8,(string *)(p_Var5 + 1));
          std::operator<<((ostream *)(local_128._M_head_impl + 0x10),".\n");
        }
      }
      StringStreamToString(&local_c8,local_128._M_head_impl);
      pcVar7 = local_d0;
      __stream = _stderr;
      if (local_c8._M_string_length == 0) {
        std::__cxx11::string::~string((string *)&local_c8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        if (local_128._M_head_impl != (stringstream *)0x0) {
          (**(code **)(*(long *)local_128._M_head_impl + 8))(local_128._M_head_impl);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        return pcVar7;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_e0,(char *)(ulong)local_11c,line_00);
      fprintf(__stream,"%s %s",local_50._M_dataplus._M_p,local_c8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      fflush(_stderr);
      posix::Abort();
    }
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8,__x);
    if (sVar3 == 0) {
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
              ::count(&this->registered_tests_,__x);
      if (sVar4 == 0) {
        std::operator<<(poVar8,"No test named ");
        std::operator<<(poVar8,(string *)__x);
        pcVar7 = " can be found in this test suite.\n";
        goto LAB_0019b4b5;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_a8,__x);
    }
    else {
      std::operator<<(poVar8,"Test ");
      std::operator<<(poVar8,(string *)__x);
      pcVar7 = " is listed more than once.\n";
LAB_0019b4b5:
      std::operator<<(poVar8,pcVar7);
    }
    __x = __x + 1;
  } while( true );
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end(); ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (!errors_str.empty()) {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}